

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void curve_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey
              ,int vis)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  _glist *p_Var5;
  _glist *x;
  _glist *x_00;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  t_pd f;
  ulong uVar11;
  float fVar12;
  t_float tVar13;
  t_float tVar14;
  float local_754;
  char *tags [3];
  char tag [80];
  char tag0 [80];
  t_word pix [200];
  
  uVar10 = *(uint *)&z[0xd].g_next;
  tags[0] = tag;
  tags[1] = tag0;
  tags[2] = "curve";
  if (vis == 0) {
    sprintf(tag0,"curve%lx",z);
    iVar2 = sprintf(tag,"curve%lx_data%lx",z,data);
    if (1 < (int)uVar10) {
      p_Var5 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
      pdgui_vmess((char *)0x0,"crs",p_Var5,"delete",tag);
    }
  }
  else if (*(char *)&z[0xb].g_pd == '\x01') {
    if (*(char *)((long)&z[0xb].g_pd + 1) == '\0') {
      fVar12 = *(float *)&z[0xb].g_next;
    }
    else {
      fVar12 = template_getfloat(template,(t_symbol *)z[0xb].g_next,data,0);
    }
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      sprintf(tag0,"curve%lx",z);
      sprintf(tag,"curve%lx_data%lx",z,data);
      if ((int)uVar10 < 2) {
        post("warning: drawing shapes need at least two points to be graphed");
      }
      else {
        uVar1 = *(uint *)&z[3].g_pd;
        tVar13 = fielddesc_getfloat((_fielddesc *)&z[8].g_next,template,data,1);
        uVar4 = 100;
        if (uVar10 < 100) {
          uVar4 = uVar10;
        }
        f = z[0xe].g_pd;
        uVar11 = 0;
        do {
          tVar14 = fielddesc_getcoord((_fielddesc *)f,template,data,1);
          tVar14 = glist_xtopixels(glist,tVar14 + basex);
          *(t_float *)((long)pix + uVar11) = tVar14;
          tVar14 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,1);
          tVar14 = glist_ytopixels(glist,tVar14 + basey);
          *(t_float *)((long)pix + uVar11 + 8) = tVar14;
          uVar11 = uVar11 + 0x10;
          f = (t_pd)&f->c_symbolmethod;
        } while (uVar4 << 4 != uVar11);
        local_754 = 1.0;
        if (1.0 <= tVar13) {
          local_754 = tVar13;
        }
        if ((glist->field_0xe9 & 1) != 0) {
          iVar2 = glist_getzoom(glist);
          local_754 = local_754 * (float)iVar2;
        }
        tVar13 = fielddesc_getfloat((_fielddesc *)(z + 6),template,data,1);
        uVar10 = (int)tVar13;
        if ((int)tVar13 < 1) {
          uVar10 = 0;
        }
        uVar11 = (ulong)uVar10 * 0x66666667;
        uVar7 = (uint)(uVar11 >> 0x20);
        uVar3 = (uint)((ulong)uVar10 * 0x51eb851f >> 0x20) & 0x3fffffe0;
        if (0xfe < uVar3) {
          uVar3 = 0xff;
        }
        uVar6 = ((uVar7 >> 2) + (int)(uVar11 / 0x2800000000) * -10) * 0x20;
        if (0xfe < uVar6) {
          uVar6 = 0xff;
        }
        uVar10 = (uVar10 + ((uVar7 >> 2) + (uVar7 >> 2)) * -5) * 0x20;
        if (0xfe < uVar10) {
          uVar10 = 0xff;
        }
        uVar11 = (ulong)(uVar10 | uVar3 << 0x10 | uVar6 << 8);
        p_Var5 = glist_getcanvas((_glist *)(ulong)(uVar3 << 0x10));
        pcVar9 = "polygon";
        if ((uVar1 & 1) == 0) {
          pcVar9 = "line";
        }
        pdgui_vmess((char *)0x0,"crr iiii rf ri rS",(double)local_754,p_Var5,"create",pcVar9,0,0,0,0
                    ,"-width","-smooth",(ulong)(uVar1 >> 1 & 1),"-tags",3,tags);
        p_Var5 = glist_getcanvas(x);
        pdgui_vmess((char *)0x0,"crs w",p_Var5,"coords",tag,(ulong)(uVar4 * 2),pix);
        if ((uVar1 & 1) == 0) {
          p_Var5 = glist_getcanvas(x_00);
          pdgui_vmess((char *)0x0,"crs rk",p_Var5,"itemconfigure",tag,"-fill",uVar11);
        }
        else {
          tVar13 = fielddesc_getfloat((_fielddesc *)&z[3].g_next,template,data,1);
          uVar10 = (int)tVar13;
          if ((int)tVar13 < 1) {
            uVar10 = 0;
          }
          uVar8 = (ulong)uVar10 * 0x66666667;
          uVar1 = (uint)(uVar8 >> 0x20);
          uVar7 = uVar1 >> 2;
          uVar4 = (uint)((ulong)uVar10 * 0x51eb851f >> 0x20) & 0x3fffffe0;
          if (0xfe < uVar4) {
            uVar4 = 0xff;
          }
          uVar3 = (uVar7 + (int)(uVar8 / 0x2800000000) * -10) * 0x20;
          if (0xfe < uVar3) {
            uVar3 = 0xff;
          }
          uVar10 = (uVar10 + (uVar7 + (uVar1 >> 2)) * -5) * 0x20;
          if (0xfe < uVar10) {
            uVar10 = 0xff;
          }
          p_Var5 = glist_getcanvas((_glist *)(ulong)(uVar4 << 0x10));
          pdgui_vmess((char *)0x0,"crs rk rk",p_Var5,"itemconfigure",tag,"-fill",
                      (ulong)(uVar10 | uVar4 << 0x10 | uVar3 << 8),"-outline",uVar11);
        }
      }
    }
  }
  return;
}

Assistant:

static void curve_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int vis)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    char tag0[80], tag[80];
    const char*tags[] = {tag, tag0, "curve"};
        /* see comment in plot_vis() */
    if (vis && !fielddesc_getfloat(&x->x_vis, template, data, 0))
        return;
    sprintf(tag0, "curve%lx", x);
    sprintf(tag , "curve%lx_data%lx", x, data);
    if (vis)
    {
        if (n > 1)
        {
            int flags = x->x_flags, closed = (flags & CLOSED);
            t_float width = fielddesc_getfloat(&x->x_width, template, data, 1);
            int outline;
            t_word pix[200];

            if (n > 100)
                n = 100;
                /* calculate the pixel values before we start printing
                out the TK message so that "error" printout won't be
                interspersed with it.  Only show up to 100 points so we don't
                have to allocate memory here. */
            for (i = 0, f = x->x_vec; i < n; i++, f += 2)
            {
                pix[2*i].w_float = glist_xtopixels(glist,
                    basex + fielddesc_getcoord(f, template, data, 1));
                pix[2*i+1].w_float = glist_ytopixels(glist,
                    basey + fielddesc_getcoord(f+1, template, data, 1));
            }
            if (width < 1) width = 1;
            if (glist->gl_isgraph)
                width *= glist_getzoom(glist);
            outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            pdgui_vmess(0, "crr iiii rf ri rS",
                glist_getcanvas(glist), "create",
                (flags & CLOSED)?"polygon":"line",
                0, 0, 0, 0,
                "-width", width,
                "-smooth", !!(flags & BEZ),
                "-tags", 3, tags);

            pdgui_vmess(0, "crs w",
                glist_getcanvas(glist), "coords", tag,
                2*n, pix);

            if (flags & CLOSED)
            {
                int fill = numbertocolor(
                    fielddesc_getfloat(&x->x_fillcolor, template, data, 1));
                pdgui_vmess(0, "crs rk rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", fill,
                    "-outline", outline);
            } else
                pdgui_vmess(0, "crs rk",
                    glist_getcanvas(glist), "itemconfigure", tag,
                    "-fill", outline);
        }
        else post("warning: drawing shapes need at least two points to be graphed");
    }
    else
    {
        if (n > 1)
            pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}